

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

chunk * classic_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  short sVar1;
  ushort uVar2;
  room_profile *prVar3;
  loc to_avoid;
  room_profile profile;
  _Bool _Var4;
  int16_t iVar5;
  uint32_t uVar6;
  uint uVar7;
  wchar_t wVar8;
  uint32_t uVar9;
  quest *pqVar10;
  chunk *c;
  _Bool **pp_Var11;
  _Bool *p_Var12;
  void *p_00;
  void *pvVar13;
  dun_data *pdVar14;
  cave_profile *pcVar15;
  wchar_t wVar16;
  undefined1 (*pauVar17) [12];
  wchar_t wVar18;
  wchar_t wVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  wchar_t bx0;
  ulong uVar26;
  int local_4c;
  
  wVar19 = dun->profile->dun_unusual;
  uVar6 = Rand_div(10);
  sVar1 = p->depth;
  pqVar10 = find_quest((int)p->place);
  pdVar14 = dun;
  iVar22 = 100;
  if (pqVar10 == (quest *)0x0) {
    uVar7 = (int)(sVar1 / 0x18) + uVar6 + 1;
    if ((int)uVar7 < 2) {
      iVar22 = 0x4b;
    }
    else if (uVar7 == 2) {
      iVar22 = 0x50;
    }
    else if (uVar7 < 4) {
      iVar22 = 0x55;
    }
    else if (uVar7 == 4) {
      iVar22 = 0x5a;
    }
    else {
      iVar22 = (uint)(5 < uVar7) * 5 + 0x5f;
    }
  }
  uVar7 = (iVar22 * dun->profile->dun_rooms) / 100;
  wVar8 = dun->profile->block_size;
  dun->block_hgt = wVar8;
  pdVar14->block_wid = wVar8;
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = (int)p->place;
  if ((player->opts).opt[0x18] == true) {
    msg("height=%d  width=%d  nrooms=%d",(ulong)(uint)c->height,(ulong)(uint)c->width,(ulong)uVar7);
  }
  fill_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',FEAT_GRANITE,L'\0'
                );
  pdVar14 = dun;
  wVar8 = c->height / dun->block_hgt;
  dun->row_blocks = wVar8;
  pdVar14->col_blocks = c->width / pdVar14->block_wid;
  pp_Var11 = (_Bool **)mem_zalloc((long)wVar8 << 3);
  pdVar14 = dun;
  dun->room_map = pp_Var11;
  for (lVar20 = 0; lVar20 < pdVar14->row_blocks; lVar20 = lVar20 + 1) {
    p_Var12 = (_Bool *)mem_zalloc((long)pdVar14->col_blocks);
    dun->room_map[lVar20] = p_Var12;
    pdVar14 = dun;
  }
  p_00 = mem_zalloc((long)pdVar14->row_blocks << 3);
  for (lVar20 = 0; pdVar14 = dun, lVar20 < dun->row_blocks; lVar20 = lVar20 + 1) {
    pvVar13 = mem_zalloc((long)dun->col_blocks);
    *(void **)((long)p_00 + lVar20 * 8) = pvVar13;
  }
  dun->pit_num = L'\0';
  pdVar14->cent_n = L'\0';
  reset_entrance_data(c);
  if (dun->persist == true) {
    build_staircase_rooms(c,"Classic Generation");
  }
  local_4c = 0;
  do {
    if ((int)uVar7 <= local_4c) {
LAB_00144ab1:
      for (lVar20 = 0; lVar20 < dun->row_blocks; lVar20 = lVar20 + 1) {
        mem_free(*(void **)((long)p_00 + lVar20 * 8));
        mem_free(dun->room_map[lVar20]);
      }
      mem_free(p_00);
      mem_free(dun->room_map);
      draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',FEAT_PERM,
                     L'\0',true);
      do_traditional_tunneling(c);
      ensure_connectedness(c,true);
      for (wVar19 = L'\0'; pcVar15 = dun->profile, wVar19 < (pcVar15->str).mag;
          wVar19 = wVar19 + L'\x01') {
        build_streamer(c,FEAT_MAGMA,(pcVar15->str).mc);
      }
      for (wVar19 = L'\0'; wVar19 < (pcVar15->str).qua; wVar19 = wVar19 + L'\x01') {
        build_streamer(c,FEAT_QUARTZ,(pcVar15->str).qc);
        pcVar15 = dun->profile;
      }
      _Var4 = dun->persist;
      wVar19 = rand_range(3,4);
      wVar8 = rand_range(1,2);
      handle_level_stairs(c,_Var4,wVar19,wVar8);
      wVar19 = c->depth;
      uVar6 = (uint)(L'\x05' < wVar19) * 8 + 2;
      if (0xffffffe4 < (uint)(wVar19 + L'\xffffffdf')) {
        uVar6 = wVar19 / 3;
      }
      uVar9 = Rand_div(uVar6);
      alloc_objects((chunk_conflict *)c,L'\x01',L'\0',uVar9 + L'\x01',c->depth,'\0');
      uVar9 = Rand_div(uVar6);
      alloc_objects((chunk_conflict *)c,L'\x01',L'\x01',(int)(uVar9 + 1) / 5,c->depth,'\0');
      _Var4 = new_player_spot((chunk_conflict *)c,p);
      if (_Var4) {
        uVar2 = z_info->level_monster_min;
        uVar9 = Rand_div(8);
        for (iVar22 = (uint)uVar2 + uVar6 + uVar9 + 1; 0 < iVar22; iVar22 = iVar22 + -1) {
          to_avoid.x = (p->grid).x;
          to_avoid.y = (p->grid).y;
          pick_and_place_distant_monster(c,to_avoid,L'\0',true,c->depth);
        }
        iVar5 = Rand_normal((uint)z_info->room_item_av,3);
        alloc_objects((chunk_conflict *)c,L'\x02',L'\x03',(int)iVar5,c->depth,'\x01');
        iVar5 = Rand_normal((uint)z_info->both_item_av,3);
        alloc_objects((chunk_conflict *)c,L'\x03',L'\x03',(int)iVar5,c->depth,'\x01');
        iVar5 = Rand_normal((uint)z_info->both_gold_av,3);
        alloc_objects((chunk_conflict *)c,L'\x03',L'\x02',(int)iVar5,c->depth,'\x01');
      }
      else {
        uncreate_artifacts((chunk_conflict *)c);
        wipe_mon_list(c,p);
        cave_free((chunk_conflict *)c);
        *p_error = "could not place player";
        c = (chunk *)0x0;
      }
      return c;
    }
    uVar21 = 0;
    uVar26 = 0;
    uVar6 = 0;
    pdVar14 = dun;
    for (uVar24 = 0; (long)uVar24 < (long)pdVar14->row_blocks; uVar24 = uVar24 + 1) {
      for (uVar23 = 0; (long)uVar23 < (long)pdVar14->col_blocks; uVar23 = uVar23 + 1) {
        if (*(char *)(*(long *)((long)p_00 + uVar24 * 8) + uVar23) == '\0') {
          uVar6 = uVar6 + 1;
          uVar9 = Rand_div(uVar6);
          pdVar14 = dun;
          if (uVar9 == 0) {
            uVar21 = uVar24 & 0xffffffff;
            uVar26 = uVar23 & 0xffffffff;
          }
        }
      }
    }
    if (uVar6 == 0) goto LAB_00144ab1;
    wVar8 = (wchar_t)uVar21;
    lVar20 = *(long *)((long)p_00 + (long)wVar8 * 8);
    bx0 = (wchar_t)uVar26;
    if (*(char *)(lVar20 + bx0) == '\x01') {
      quit_fmt("generation: inconsistent blocks");
      lVar20 = *(long *)((long)p_00 + (long)wVar8 * 8);
    }
    *(undefined1 *)(lVar20 + bx0) = 1;
    uVar6 = Rand_div(100);
    wVar16 = L'\0';
    for (wVar18 = L'\0'; (wVar16 == wVar18 && (wVar18 < dun->profile->max_rarity));
        wVar18 = (uint)((int)uVar9 < c->depth / 2 + 0x32) + wVar18) {
      uVar9 = Rand_div(wVar19);
      wVar16 = wVar18 + L'\x01';
    }
    lVar25 = 0;
    pdVar14 = dun;
    for (lVar20 = 0; lVar20 < pdVar14->profile->n_room_profiles; lVar20 = lVar20 + 1) {
      prVar3 = pdVar14->profile->room_profiles;
      if ((*(wchar_t *)((long)&prVar3->rarity + lVar25) <= wVar18) &&
         ((int)uVar6 < *(int *)((long)&prVar3->cutoff + lVar25))) {
        pauVar17 = (undefined1 (*) [12])((long)&prVar3->next + lVar25);
        profile.name._4_4_ = (int)((ulong)*(undefined8 *)(*pauVar17 + 8) >> 0x20);
        profile._0_12_ = *pauVar17;
        profile.builder = (room_builder)*(undefined8 *)(pauVar17[1] + 4);
        profile.rating = *(wchar_t *)((long)(pauVar17 + 2) + 0);
        profile.height = *(wchar_t *)((long)(pauVar17 + 2) + 4);
        profile._32_8_ = *(undefined8 *)(pauVar17[2] + 8);
        profile._40_8_ = *(undefined8 *)(pauVar17[3] + 4);
        profile._48_8_ = *(undefined8 *)pauVar17[4];
        _Var4 = room_build(c,wVar8,bx0,profile,false);
        local_4c = local_4c + (uint)_Var4;
        pdVar14 = dun;
        if (_Var4) break;
      }
      lVar25 = lVar25 + 0x38;
    }
  } while( true );
}

Assistant:

struct chunk *classic_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, j, k;
	int by, bx = 0, tby, tbx, key, rarity, built;
	int num_rooms, size_percent;
	int dun_unusual = dun->profile->dun_unusual;

	bool **blocks_tried;
	struct chunk *c;

	/* This code currently does nothing - see comments below */
	i = randint1(10) + p->depth / 24;
	if (find_quest(p->place)) size_percent = 100;
	else if (i < 2) size_percent = 75;
	else if (i < 3) size_percent = 80;
	else if (i < 4) size_percent = 85;
	else if (i < 5) size_percent = 90;
	else if (i < 6) size_percent = 95;
	else size_percent = 100;

	/* scale the various generation variables */
	num_rooms = (dun->profile->dun_rooms * size_percent) / 100;
	dun->block_hgt = dun->profile->block_size;
	dun->block_wid = dun->profile->block_size;
	c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = p->place;
	ROOM_LOG("height=%d  width=%d  nrooms=%d", c->height, c->width, num_rooms);

	/* Fill cave area with basic granite */
	fill_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_GRANITE, SQUARE_NONE);

	/* Actual maximum number of rooms on this level */
	dun->row_blocks = c->height / dun->block_hgt;
	dun->col_blocks = c->width / dun->block_wid;

	/* Initialize the room table */
	dun->room_map = mem_zalloc(dun->row_blocks * sizeof(bool*));
	for (i = 0; i < dun->row_blocks; i++)
		dun->room_map[i] = mem_zalloc(dun->col_blocks * sizeof(bool));

	/* Initialize the block table */
	blocks_tried = mem_zalloc(dun->row_blocks * sizeof(bool*));

	for (i = 0; i < dun->row_blocks; i++)
		blocks_tried[i] = mem_zalloc(dun->col_blocks * sizeof(bool));

	/* No rooms yet, pits or otherwise. */
	dun->pit_num = 0;
	dun->cent_n = 0;
	reset_entrance_data(c);

	/* Build the special staircase rooms */
	if (dun->persist) {
		build_staircase_rooms(c, "Classic Generation");
	}

	/* Build some rooms.  Note that the theoretical maximum number of rooms
	 * in this profile is currently 36, so built never reaches num_rooms,
	 * and room generation is always terminated by having tried all blocks */
	built = 0;
	while(built < num_rooms) {

		/* Count the room blocks we haven't tried yet. */
		j = 0;
		tby = 0;
		tbx = 0;
		for(by = 0; by < dun->row_blocks; by++) {
			for(bx = 0; bx < dun->col_blocks; bx++) {
				if (blocks_tried[by][bx]) continue;
				j++;
				if (one_in_(j)) {
					tby = by;
					tbx = bx;
				}
			} 
		}
		bx = tbx;
		by = tby;

		/* If we've tried all blocks we're done. */
		if (j == 0) break;

		if (blocks_tried[by][bx]) quit_fmt("generation: inconsistent blocks");

		/* Mark that we are trying this block. */
		blocks_tried[by][bx] = true;

		/* Roll for random key (to be compared against a profile's cutoff) */
		key = randint0(100);

		/* We generate a rarity number to figure out how exotic to make
		 * the room. This number has a (50+depth/2)/DUN_UNUSUAL chance
		 * of being > 0, a (50+depth/2)^2/DUN_UNUSUAL^2 chance of
		 * being > 1, up to MAX_RARITY. */
		i = 0;
		rarity = 0;
		while (i == rarity && i < dun->profile->max_rarity) {
			if (randint0(dun_unusual) < 50 + c->depth / 2) rarity++;
			i++;
		}

		/* Once we have a key and a rarity, we iterate through out list of
		 * room profiles looking for a match (whose cutoff > key and whose
		 * rarity > this rarity). We try building the room, and if it works
		 * then we are done with this iteration. We keep going until we find
		 * a room that we can build successfully or we exhaust the profiles. */
		for (i = 0; i < dun->profile->n_room_profiles; i++) {
			struct room_profile profile = dun->profile->room_profiles[i];
			if (profile.rarity > rarity) continue;
			if (profile.cutoff <= key) continue;
			
			if (room_build(c, by, bx, profile, false)) {
				built++;
				break;
			}
		}
	}

	for (i = 0; i < dun->row_blocks; i++){
		mem_free(blocks_tried[i]);
		mem_free(dun->room_map[i]);
	}
	mem_free(blocks_tried);
	mem_free(dun->room_map);

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_PERM, SQUARE_NONE, true);

	/* Connect all the rooms together */
	do_traditional_tunneling(c);
	ensure_connectedness(c, true);

	/* Add some magma streamers */
	for (i = 0; i < dun->profile->str.mag; i++)
		build_streamer(c, FEAT_MAGMA, dun->profile->str.mc);

	/* Add some quartz streamers */
	for (i = 0; i < dun->profile->str.qua; i++)
		build_streamer(c, FEAT_QUARTZ, dun->profile->str.qc);

	/* Place 3 or 4 down stairs and 1 or 2 up stairs near some walls */
	handle_level_stairs(c, dun->persist, rand_range(3, 4), rand_range(1, 2));

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(c->depth / 3, 10), 2);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon, reduce frequency by factor of 5 */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k)/5, c->depth, 0);

	/* Determine the character location */
	if (!new_player_spot(c, p)) {
		uncreate_artifacts(c);
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "could not place player";
		return NULL;
	}

	/* Pick a base number of monsters */
	i = z_info->level_monster_min + randint1(8) + k;

	/* Put some monsters in the dungeon */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(c, p->grid, 0, true, c->depth);
	}

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}